

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

void __thiscall BasicTestingSetup::~BasicTestingSetup(BasicTestingSetup *this)

{
  Logger *this_00;
  long in_FS_OFFSET;
  path local_70;
  path local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
            ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)
             &(this->m_node).ecc_context,(pointer)0x0);
  std::__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>::reset
            ((__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_> *)
             &this->m_node,(pointer)0x0);
  SetMockTime((seconds)0x0);
  this_00 = LogInstance();
  BCLog::Logger::DisconnectTestLogger(this_00);
  if (this->m_has_custom_datadir == true) {
    fs::path::path((path *)&local_48,".lock");
    UnlockDirectory(&this->m_path_lock,(path *)&local_48);
    std::filesystem::__cxx11::path::~path(&local_48);
    std::filesystem::__cxx11::path::path(&local_70,&(this->m_path_lock).super_path);
    fs::operator/((path *)&local_48,(path *)&local_70,".lock");
    std::filesystem::remove((path *)&local_48);
    std::filesystem::__cxx11::path::~path(&local_48);
    std::filesystem::__cxx11::path::~path(&local_70);
  }
  else {
    std::filesystem::remove_all((path *)&this->m_path_root);
  }
  ArgsManager::ClearArgs(&gArgs);
  ArgsManager::~ArgsManager(&this->m_args);
  std::filesystem::__cxx11::path::~path(&(this->m_path_lock).super_path);
  std::filesystem::__cxx11::path::~path(&(this->m_path_root).super_path);
  ChaCha20::~ChaCha20(&(this->m_rng).rng);
  ::node::NodeContext::~NodeContext(&this->m_node);
  util::SignalInterrupt::~SignalInterrupt(&this->m_interrupt);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BasicTestingSetup::~BasicTestingSetup()
{
    m_node.ecc_context.reset();
    m_node.kernel.reset();
    SetMockTime(0s); // Reset mocktime for following tests
    LogInstance().DisconnectTestLogger();
    if (m_has_custom_datadir) {
        // Only remove the lock file, preserve the data directory.
        UnlockDirectory(m_path_lock, ".lock");
        fs::remove(m_path_lock / ".lock");
    } else {
        fs::remove_all(m_path_root);
    }
    gArgs.ClearArgs();
}